

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall tonk::Connection::setPeerAddress(Connection *this,UDPAddress *peerUDPAddress)

{
  SessionOutgoing *pSVar1;
  long in_RDI;
  bool insertSuccess;
  Locker locker;
  LogStringBuffer buffer;
  Lock *in_stack_fffffffffffffaa8;
  LogStringBuffer *in_stack_fffffffffffffab0;
  undefined6 in_stack_fffffffffffffab8;
  undefined2 in_stack_fffffffffffffabe;
  string *in_stack_fffffffffffffac8;
  OutputWorker *in_stack_fffffffffffffad0;
  SessionOutgoing *in_stack_fffffffffffffae8;
  SessionOutgoing *in_stack_fffffffffffffaf0;
  IConnection *connection;
  UDPAddress *in_stack_fffffffffffffb48;
  UDPAddress *in_stack_fffffffffffffb50;
  ConnectionAddrMap *in_stack_fffffffffffffb58;
  string local_498 [32];
  string local_478 [54];
  unsigned_short local_442;
  UDPAddress *in_stack_fffffffffffffbc0;
  Connection *in_stack_fffffffffffffbc8;
  string local_420 [32];
  IConnection local_400;
  undefined8 in_stack_fffffffffffffc60;
  uint16_t port;
  string *in_stack_fffffffffffffc68;
  undefined1 local_330 [16];
  ostream aoStack_320 [376];
  __pthread_internal_list *local_1a8;
  char *local_1a0;
  string *local_198;
  char *local_190;
  undefined4 local_184;
  SessionOutgoing *local_180;
  __pthread_internal_list *local_178;
  char *local_170;
  string *local_168;
  char *local_160;
  string *local_158;
  undefined1 *local_150;
  SessionOutgoing *local_148;
  string *local_140;
  undefined1 *local_138;
  SessionOutgoing *local_130;
  string *local_128;
  undefined1 *local_120;
  __pthread_internal_list *local_118;
  char *local_110;
  string *local_108;
  char *local_100;
  undefined1 *local_f8;
  SessionOutgoing *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  SessionOutgoing *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  __pthread_internal_list *local_c0;
  char *local_b8;
  string *local_b0;
  undefined1 *local_a8;
  SessionOutgoing *local_a0;
  string *local_98;
  undefined1 *local_90;
  SessionOutgoing *local_88;
  string *local_80;
  undefined1 *local_78;
  __pthread_internal_list *local_70;
  char *local_68;
  undefined1 *local_60;
  SessionOutgoing *local_58;
  __pthread_internal_list *local_50;
  undefined1 *local_48;
  SessionOutgoing *local_40;
  __pthread_internal_list *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  SessionOutgoing *local_18;
  char *local_10;
  undefined1 *local_8;
  
  port = (uint16_t)((ulong)in_stack_fffffffffffffc60 >> 0x30);
  local_400.SelfRefCount.ShutdownLock.super___mutex_base._M_mutex._16_8_ = in_RDI + 0x168;
  connection = &local_400;
  local_400.SelfRefCount.ShutdownLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)connection;
  Locker::Locker((Locker *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
            ((basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffffab0,
             (basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffffaa8);
  Locker::~Locker((Locker *)0x1386ee);
  local_400.SelfRefCount._23_1_ =
       ConnectionAddrMap::ChangeAddress
                 (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                  connection);
  if (!(bool)local_400.SelfRefCount._23_1_) {
    pSVar1 = (SessionOutgoing *)(in_RDI + 0x110);
    asio::ip::basic_endpoint<asio::ip::udp>::address
              ((basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffffaa8);
    asio::ip::address::to_string_abi_cxx11_
              ((address *)CONCAT26(in_stack_fffffffffffffabe,in_stack_fffffffffffffab8));
    local_442 = asio::ip::basic_endpoint<asio::ip::udp>::port
                          ((basic_endpoint<asio::ip::udp> *)0x138776);
    in_stack_fffffffffffffc68 = local_420;
    port = 0;
    local_400.SelfRefCount.ShutdownLock.super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)&local_442;
    if (*(int *)(in_RDI + 0x118) < 4) {
      local_184 = 3;
      local_190 = "Unable to change address (already taken in map): ";
      local_1a0 = ":";
      local_1a8 = local_400.SelfRefCount.ShutdownLock.super___mutex_base._M_mutex.__data.__list.
                  __next;
      local_198 = in_stack_fffffffffffffc68;
      local_180 = pSVar1;
      port = 0;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8,Trace);
      local_158 = (string *)(in_RDI + 0x148);
      local_150 = local_330;
      local_160 = local_190;
      local_168 = local_198;
      local_170 = local_1a0;
      local_178 = local_1a8;
      local_148 = pSVar1;
      local_140 = local_158;
      local_138 = local_150;
      local_130 = pSVar1;
      local_128 = local_158;
      local_120 = local_150;
      std::operator<<(aoStack_320,local_158);
      local_f8 = local_150;
      local_100 = local_160;
      local_108 = local_168;
      local_110 = local_170;
      local_118 = local_178;
      local_e0 = local_150;
      local_e8 = local_160;
      local_c8 = local_150;
      local_d0 = local_160;
      in_stack_fffffffffffffaf0 = pSVar1;
      local_f0 = pSVar1;
      local_d8 = pSVar1;
      std::operator<<((ostream *)(local_150 + 0x10),local_160);
      local_a8 = local_f8;
      local_b0 = (string *)local_108;
      local_b8 = local_110;
      local_c0 = local_118;
      local_90 = local_f8;
      local_98 = (string *)local_108;
      local_78 = local_f8;
      local_80 = (string *)local_108;
      in_stack_fffffffffffffae8 = pSVar1;
      local_a0 = pSVar1;
      local_88 = pSVar1;
      std::operator<<((ostream *)(local_f8 + 0x10),(string *)local_108);
      local_60 = local_a8;
      local_68 = local_b8;
      local_70 = local_c0;
      local_20 = local_a8;
      local_28 = local_b8;
      local_8 = local_a8;
      local_10 = local_b8;
      local_58 = pSVar1;
      local_18 = pSVar1;
      std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
      local_48 = local_60;
      local_50 = local_70;
      local_30 = local_60;
      local_38 = local_70;
      local_40 = pSVar1;
      std::ostream::operator<<((ostream *)(local_60 + 0x10),*(ushort *)&local_70->__prev);
      in_stack_fffffffffffffad0 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write
                ((OutputWorker *)in_stack_fffffffffffffaf0,
                 (LogStringBuffer *)in_stack_fffffffffffffae8);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x138cd6);
    }
    std::__cxx11::string::~string((string *)local_420);
  }
  SessionOutgoing::SetPeerUDPAddress
            (in_stack_fffffffffffffaf0,(UDPAddress *)in_stack_fffffffffffffae8);
  queueAddressAndIdChangeMessage(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  asio::ip::basic_endpoint<asio::ip::udp>::address
            ((basic_endpoint<asio::ip::udp> *)(in_RDI + 0x110));
  asio::ip::address::to_string_abi_cxx11_
            ((address *)CONCAT26(in_stack_fffffffffffffabe,in_stack_fffffffffffffab8));
  asio::ip::basic_endpoint<asio::ip::udp>::port((basic_endpoint<asio::ip::udp> *)0x138da1);
  GetConnectionLogPrefix(in_stack_fffffffffffffc68,port);
  logger::Channel::SetPrefix((Channel *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  std::__cxx11::string::~string(local_478);
  std::__cxx11::string::~string(local_498);
  return;
}

Assistant:

void Connection::setPeerAddress(const UDPAddress& peerUDPAddress)
{
    const bool insertSuccess = Deps.AddressMap->ChangeAddress(
        Outgoing.GetPeerUDPAddress(),
        peerUDPAddress,
        this);

    // If unable to insert the address because it is already listed:
    if (!insertSuccess)
    {
        Logger.Warning("Unable to change address (already taken in map): ",
            peerUDPAddress.address().to_string(), ":", peerUDPAddress.port());
    }

    Outgoing.SetPeerUDPAddress(peerUDPAddress);

    queueAddressAndIdChangeMessage(peerUDPAddress);

    Logger.SetPrefix(GetConnectionLogPrefix(
        peerUDPAddress.address().to_string(),
        peerUDPAddress.port()));
}